

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O1

VariableIndex __thiscall
cnn::ComputationGraph::add_lookup
          (ComputationGraph *this,LookupParameters *p,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  iterator __position;
  iterator __position_00;
  LookupNode *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  LookupNode *local_30;
  
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)(*(long *)(p->dim).d - (long)(p->super_ParametersBase)._vptr_ParametersBase) >>
            3);
  this_00 = (LookupNode *)operator_new(0xa8);
  LookupNode::LookupNode(this_00,(LookupParameters *)indices,in_RCX);
  __position._M_current = *(Node ***)(p->dim).d;
  local_30 = this_00;
  if (__position._M_current == *(Node ***)((p->dim).d + 2)) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)p,__position,(Node **)&local_30);
  }
  else {
    *__position._M_current = (Node *)this_00;
    *(long *)(p->dim).d = *(long *)(p->dim).d + 8;
  }
  __position_00._M_current = *(VariableIndex **)((p->dim).d + 6);
  if (__position_00._M_current == *(VariableIndex **)&(p->dim).bd) {
    std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>::
    _M_realloc_insert<cnn::VariableIndex_const&>
              ((vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>> *)((p->dim).d + 4),
               __position_00,(VariableIndex *)this);
  }
  else {
    (__position_00._M_current)->t =
         *(uint *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    *(VariableIndex **)((p->dim).d + 6) = __position_00._M_current + 1;
  }
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_lookup(LookupParameters* p, const std::vector<unsigned>& indices) {
  VariableIndex new_node_index(nodes.size());
  LookupNode* new_node = new LookupNode(p, indices);
  nodes.push_back(new_node);
  parameter_nodes.push_back(new_node_index);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}